

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

void Aig_ManChoiceEval(Aig_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *vSupp_00;
  Aig_Obj_t *pObj;
  uint local_30;
  int local_2c;
  int Counter;
  int i;
  Aig_Obj_t *pTemp;
  Aig_Obj_t *pNode;
  Vec_Ptr_t *vSupp;
  Aig_Man_t *p_local;
  
  vSupp_00 = Vec_PtrAlloc(100);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_2c);
    if (((pObj != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj), iVar1 != 0)) &&
       (iVar1 = Aig_ObjIsChoice(p,pObj), iVar1 != 0)) {
      local_30 = 0;
      for (_Counter = pObj; _Counter != (Aig_Obj_t *)0x0; _Counter = Aig_ObjEquiv(p,_Counter)) {
        local_30 = local_30 + 1;
      }
      printf("Choice node = %5d. Level = %2d. Choices = %d. { ",(ulong)(uint)pObj->Id,
             (ulong)((uint)((ulong)*(undefined8 *)&pObj->field_0x18 >> 0x20) & 0xffffff),
             (ulong)local_30);
      for (_Counter = pObj; _Counter != (Aig_Obj_t *)0x0; _Counter = Aig_ObjEquiv(p,_Counter)) {
        uVar2 = Aig_NodeMffcSupp(p,_Counter,0,vSupp_00);
        uVar3 = Vec_PtrSize(vSupp_00);
        printf("S=%d N=%d L=%d  ",(ulong)uVar3,(ulong)uVar2,
               (ulong)((uint)((ulong)*(undefined8 *)&_Counter->field_0x18 >> 0x20) & 0xffffff));
      }
      printf("}\n");
    }
  }
  Vec_PtrFree(vSupp_00);
  return;
}

Assistant:

void Aig_ManChoiceEval( Aig_Man_t * p )
{
    Vec_Ptr_t * vSupp;
    Aig_Obj_t * pNode, * pTemp;
    int i, Counter;

    vSupp = Vec_PtrAlloc( 100 );
    Aig_ManForEachNode( p, pNode, i )
    {
        if ( !Aig_ObjIsChoice(p, pNode) )
            continue; 
        Counter = 0;
        for ( pTemp = pNode; pTemp; pTemp = Aig_ObjEquiv(p, pTemp) )
            Counter++;
        printf( "Choice node = %5d. Level = %2d. Choices = %d. { ", pNode->Id, pNode->Level, Counter );
        for ( pTemp = pNode; pTemp; pTemp = Aig_ObjEquiv(p, pTemp) )
        {
            Counter = Aig_NodeMffcSupp( p, pTemp, 0, vSupp );
            printf( "S=%d N=%d L=%d  ", Vec_PtrSize(vSupp), Counter, pTemp->Level );
        }
        printf( "}\n" );
    }
    Vec_PtrFree( vSupp );
}